

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_2::HasConflictingMemberOffsets
               (set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                *type1_decorations,
               set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
               *type2_decorations)

{
  value_type vVar1;
  bool bVar2;
  bool bVar3;
  Decoration DVar4;
  reference this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  const_reference pvVar6;
  pointer this_00;
  _Self local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Rb_tree_const_iterator<spvtools::val::Decoration> local_58;
  _Self local_50;
  _Rb_tree_const_iterator<spvtools::val::Decoration> i;
  anon_class_8_1_6d26026e_for__M_pred compare;
  Decoration *decoration;
  iterator __end3;
  iterator __begin3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *type2_decorations_local;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *type1_decorations_local;
  
  __end3 = std::
           set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
           ::begin(type1_decorations);
  decoration = (Decoration *)
               std::
               set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
               ::end(type1_decorations);
  do {
    bVar2 = std::operator!=(&__end3,(_Self *)&decoration);
    if (!bVar2) {
      return false;
    }
    this = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end3);
    DVar4 = Decoration::dec_type(this);
    if (DVar4 == DecorationOffset) {
      i._M_node = (_Base_ptr)this;
      local_58._M_node =
           (_Base_ptr)
           std::
           set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
           ::begin(type2_decorations);
      local_60 = (_Base_ptr)
                 std::
                 set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                 ::end(type2_decorations);
      local_68 = i._M_node;
      local_50._M_node =
           (_Base_ptr)
           std::
           find_if<std::_Rb_tree_const_iterator<spvtools::val::Decoration>,spvtools::val::(anonymous_namespace)::HasConflictingMemberOffsets(std::set<spvtools::val::Decoration,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>const&,std::set<spvtools::val::Decoration,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>const&)::__0>
                     (local_58,(_Rb_tree_const_iterator<spvtools::val::Decoration>)local_60,
                      i._M_node);
      local_70._M_node =
           (_Base_ptr)
           std::
           set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
           ::end(type2_decorations);
      bVar3 = std::operator!=(&local_50,&local_70);
      bVar2 = false;
      if (bVar3) {
        pvVar5 = Decoration::params(this);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar5);
        vVar1 = *pvVar6;
        this_00 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->(&local_50);
        pvVar5 = Decoration::params(this_00);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar5);
        bVar2 = vVar1 != *pvVar6;
      }
      if (bVar2) {
        return true;
      }
    }
    std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end3);
  } while( true );
}

Assistant:

bool HasConflictingMemberOffsets(
    const std::set<Decoration>& type1_decorations,
    const std::set<Decoration>& type2_decorations) {
  {
    // We are interested in conflicting decoration.  If a decoration is in one
    // list but not the other, then we will assume the code is correct.  We are
    // looking for things we know to be wrong.
    //
    // We do not have to traverse type2_decoration because, after traversing
    // type1_decorations, anything new will not be found in
    // type1_decoration.  Therefore, it cannot lead to a conflict.
    for (const Decoration& decoration : type1_decorations) {
      switch (decoration.dec_type()) {
        case spv::Decoration::Offset: {
          // Since these affect the layout of the struct, they must be present
          // in both structs.
          auto compare = [&decoration](const Decoration& rhs) {
            if (rhs.dec_type() != spv::Decoration::Offset) return false;
            return decoration.struct_member_index() ==
                   rhs.struct_member_index();
          };
          auto i = std::find_if(type2_decorations.begin(),
                                type2_decorations.end(), compare);
          if (i != type2_decorations.end() &&
              decoration.params().front() != i->params().front()) {
            return true;
          }
        } break;
        default:
          // This decoration does not affect the layout of the structure, so
          // just moving on.
          break;
      }
    }
  }
  return false;
}